

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void set_prisoners_and_guards_route_B(tgestate_t *state,route_t *proute)

{
  uint8_t uVar1;
  route_t route;
  routeindex_t rVar2;
  long lVar3;
  
  rVar2 = proute->index;
  uVar1 = proute->step;
  lVar3 = 0;
  do {
    route.step = uVar1;
    route.index = rVar2;
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar3],route);
    rVar2 = rVar2 + ((char)lVar3 == '\x04');
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\n');
  return;
}

Assistant:

static void set_prisoners_and_guards_route_B(tgestate_t *state,
                                       const route_t    *proute)
{
  route_t            route; /* new var */
  const character_t *pchars; /* was HL */
  uint8_t            iters;  /* was B */

  assert(state != NULL);
  ASSERT_ROUTE_VALID(*proute);

  route = *proute; /* Conv: Keep a local copy of route. */

  pchars = &prisoners_and_guards[0];
  iters = NELEMS(prisoners_and_guards);
  do
  {
    set_character_route(state, *pchars, route);

    /* When this is 6, the character being processed is
     * character_22_PRISONER_3 and the next is character_14_GUARD_14: the
     * start of the second half of the list. */
    if (iters == 6)
      route.index++;

    pchars++;
  }
  while (--iters);
}